

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall cmMakefileTargetGenerator::WriteTargetBuildRules(cmMakefileTargetGenerator *this)

{
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *pvVar1;
  pointer *pppcVar2;
  cmMakefile *pcVar3;
  cmGeneratorTarget *headTarget;
  cmLocalUnixMakefileGenerator3 *lg;
  bool bVar4;
  string *psVar5;
  char *pcVar6;
  pointer this_00;
  cmCustomCommand *cc;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar7;
  const_iterator __first;
  const_iterator __last;
  reference this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  reference pbVar9;
  reference ppcVar10;
  cmSourceFile *sf_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range1_2;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> objectSources;
  cmSourceFile *sf_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range1_1;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> externalObjects;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> extraSources;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> headerSources;
  string *byproduct_1;
  const_iterator __end3_2;
  const_iterator __begin3_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *byproducts_1;
  cmCustomCommand *be;
  iterator __end2;
  iterator __begin2;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *__range2;
  __normal_iterator<cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
  local_2e8;
  const_iterator local_2e0;
  cmCustomCommand *local_2d8;
  cmCustomCommand *local_2d0;
  __normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
  local_2c8;
  __normal_iterator<cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
  local_2c0;
  const_iterator local_2b8;
  undefined1 local_2b0 [8];
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> buildEventCommands;
  string *byproduct;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *byproducts;
  reference local_230;
  string *output;
  const_iterator __end3;
  const_iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs;
  undefined1 local_1e8 [8];
  cmCustomCommandGenerator ccg;
  cmSourceFile *sf;
  iterator __end1;
  iterator __begin1;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__range1;
  string currentBinDir;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> customCommands;
  undefined1 local_f8 [6];
  bool clean;
  char *local_d8;
  char *clean_no_custom;
  undefined1 local_b0 [8];
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  undefined1 local_90 [8];
  cmGeneratorExpression ge;
  string local_78;
  char *local_58;
  char *additional_clean_files;
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *config;
  cmMakefileTargetGenerator *this_local;
  
  pcVar3 = (this->super_cmCommonTargetGenerator).Makefile;
  config = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CMAKE_BUILD_TYPE",&local_39);
  psVar5 = cmMakefile::GetSafeDefinition(pcVar3,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pcVar3 = (this->super_cmCommonTargetGenerator).Makefile;
  local_18 = psVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"ADDITIONAL_MAKE_CLEAN_FILES",
             (allocator<char> *)
             ((long)&ge.Backtrace.TopEntry.
                     super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  pcVar6 = cmMakefile::GetProperty(pcVar3,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&ge.Backtrace.TopEntry.
                     super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi + 7));
  local_58 = pcVar6;
  if (pcVar6 != (char *)0x0) {
    cge._M_t.
    super___uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
    ._M_t.
    super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
    .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>,_true,_true>
          )(__uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
            )0x0;
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&cge);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_90,(cmListFileBacktrace *)&cge);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_b0,local_90);
    this_00 = std::
              unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              ::operator->((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                            *)local_b0);
    psVar5 = local_18;
    headTarget = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    lg = this->LocalGenerator;
    std::__cxx11::string::string((string *)&clean_no_custom);
    psVar5 = cmCompiledGeneratorExpression::Evaluate
                       (this_00,(cmLocalGenerator *)lg,psVar5,false,headTarget,
                        (cmGeneratorTarget *)0x0,(cmGeneratorExpressionDAGChecker *)0x0,
                        (string *)&clean_no_custom);
    cmSystemTools::ExpandListArgument(psVar5,&this->CleanFiles,false);
    std::__cxx11::string::~string((string *)&clean_no_custom);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_b0);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_90);
  }
  pcVar3 = (this->super_cmCommonTargetGenerator).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_f8,"CLEAN_NO_CUSTOM",
             (allocator<char> *)
             ((long)&customCommands.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pcVar6 = cmMakefile::GetProperty(pcVar3,(string *)local_f8);
  std::__cxx11::string::~string((string *)local_f8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&customCommands.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_d8 = pcVar6;
  customCommands.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = cmSystemTools::IsOff(pcVar6);
  pvVar1 = (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
           ((long)&currentBinDir.field_2 + 8);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector(pvVar1);
  cmGeneratorTarget::GetCustomCommands
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,pvVar1,local_18);
  psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                     ((cmLocalGenerator *)this->LocalGenerator);
  std::__cxx11::string::string((string *)&__range1,(string *)psVar5);
  pvVar1 = (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
           ((long)&currentBinDir.field_2 + 8);
  __end1 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin(pvVar1);
  sf = (cmSourceFile *)
       std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end(pvVar1);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                                     *)&sf), bVar4) {
    ppcVar10 = __gnu_cxx::
               __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
               ::operator*(&__end1);
    ccg.WorkingDirectory.field_2._8_8_ = *ppcVar10;
    cc = cmSourceFile::GetCustomCommand((cmSourceFile *)ccg.WorkingDirectory.field_2._8_8_);
    std::__cxx11::string::string
              ((string *)&outputs,(string *)&(this->super_cmCommonTargetGenerator).ConfigName);
    cmCustomCommandGenerator::cmCustomCommandGenerator
              ((cmCustomCommandGenerator *)local_1e8,cc,(string *)&outputs,
               (cmLocalGenerator *)this->LocalGenerator);
    std::__cxx11::string::~string((string *)&outputs);
    GenerateCustomRuleFile(this,(cmCustomCommandGenerator *)local_1e8);
    if ((customCommands.
         super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
      pvVar8 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                         ((cmCustomCommandGenerator *)local_1e8);
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(pvVar8);
      output = (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(pvVar8);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&output), bVar4) {
        local_230 = __gnu_cxx::
                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&__end3);
        cmLocalGenerator::MaybeConvertToRelativePath
                  ((string *)&byproducts,(cmLocalGenerator *)this->LocalGenerator,
                   (string *)&__range1,local_230);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->CleanFiles,(value_type *)&byproducts);
        std::__cxx11::string::~string((string *)&byproducts);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      pvVar8 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                         ((cmCustomCommandGenerator *)local_1e8);
      __end3_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(pvVar8);
      byproduct = (string *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end(pvVar8);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3_1,
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&byproduct), bVar4) {
        pbVar9 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end3_1);
        cmLocalGenerator::MaybeConvertToRelativePath
                  ((string *)
                   &buildEventCommands.
                    super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (cmLocalGenerator *)this->LocalGenerator,(string *)&__range1,pbVar9);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->CleanFiles,
                    (value_type *)
                    &buildEventCommands.
                     super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string
                  ((string *)
                   &buildEventCommands.
                    super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3_1);
      }
    }
    cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)local_1e8);
    __gnu_cxx::
    __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
    ::operator++(&__end1);
  }
  if ((customCommands.
       super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._6_1_ & 1) != 0) {
    pvVar7 = cmGeneratorTarget::GetPreBuildCommands
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::vector
              ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)local_2b0,pvVar7);
    local_2c0._M_current =
         (cmCustomCommand *)
         std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::end
                   ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)local_2b0);
    __gnu_cxx::
    __normal_iterator<cmCustomCommand_const*,std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>>
    ::__normal_iterator<cmCustomCommand*>
              ((__normal_iterator<cmCustomCommand_const*,std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>>
                *)&local_2b8,&local_2c0);
    pvVar7 = cmGeneratorTarget::GetPreLinkCommands
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    local_2c8._M_current =
         (cmCustomCommand *)
         std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::begin(pvVar7);
    pvVar7 = cmGeneratorTarget::GetPreLinkCommands
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    local_2d0 = (cmCustomCommand *)
                std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::end(pvVar7);
    local_2d8 = (cmCustomCommand *)
                std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>::
                insert<__gnu_cxx::__normal_iterator<cmCustomCommand_const*,std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>>,void>
                          ((vector<cmCustomCommand,std::allocator<cmCustomCommand>> *)local_2b0,
                           local_2b8,local_2c8,
                           (__normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
                            )local_2d0);
    local_2e8._M_current =
         (cmCustomCommand *)
         std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::end
                   ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)local_2b0);
    __gnu_cxx::
    __normal_iterator<cmCustomCommand_const*,std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>>
    ::__normal_iterator<cmCustomCommand*>
              ((__normal_iterator<cmCustomCommand_const*,std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>>
                *)&local_2e0,&local_2e8);
    pvVar7 = cmGeneratorTarget::GetPostBuildCommands
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    __first = std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::begin(pvVar7);
    pvVar7 = cmGeneratorTarget::GetPostBuildCommands
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget);
    __last = std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::end(pvVar7);
    std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>::
    insert<__gnu_cxx::__normal_iterator<cmCustomCommand_const*,std::vector<cmCustomCommand,std::allocator<cmCustomCommand>>>,void>
              ((vector<cmCustomCommand,std::allocator<cmCustomCommand>> *)local_2b0,local_2e0,
               (__normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
                )__first._M_current,
               (__normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
                )__last._M_current);
    __end2 = std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::begin
                       ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)local_2b0);
    be = (cmCustomCommand *)
         std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::end
                   ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)local_2b0);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
                                       *)&be), bVar4) {
      this_01 = __gnu_cxx::
                __normal_iterator<cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
                ::operator*(&__end2);
      pvVar8 = cmCustomCommand::GetByproducts_abi_cxx11_(this_01);
      __end3_2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(pvVar8);
      byproduct_1 = (string *)
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::end(pvVar8);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3_2,
                                (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&byproduct_1), bVar4) {
        pbVar9 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end3_2);
        cmLocalGenerator::MaybeConvertToRelativePath
                  ((string *)
                   &headerSources.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                   (cmLocalGenerator *)this->LocalGenerator,(string *)&__range1,pbVar9);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->CleanFiles,
                    (value_type *)
                    &headerSources.
                     super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string
                  ((string *)
                   &headerSources.
                    super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3_2);
      }
      __gnu_cxx::
      __normal_iterator<cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
      ::operator++(&__end2);
    }
    std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::~vector
              ((vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *)local_2b0);
  }
  pppcVar2 = &extraSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)pppcVar2);
  cmGeneratorTarget::GetHeaderSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)pppcVar2,
             local_18);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (this->OSXBundleGenerator,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
             &extraSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             &this->MacOSXContentGenerator->super_MacOSXContentGeneratorType);
  pppcVar2 = &externalObjects.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)pppcVar2);
  cmGeneratorTarget::GetExtraSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)pppcVar2,
             local_18);
  cmOSXBundleGenerator::GenerateMacOSXContentStatements
            (this->OSXBundleGenerator,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
             &externalObjects.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             &this->MacOSXContentGenerator->super_MacOSXContentGeneratorType);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range1_1);
  cmGeneratorTarget::GetExternalObjects
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range1_1,
             local_18);
  __end1_1 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                       ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                        &__range1_1);
  sf_1 = (cmSourceFile *)
         std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                   ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                    &__range1_1);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                             *)&sf_1), bVar4) {
    ppcVar10 = __gnu_cxx::
               __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
               ::operator*(&__end1_1);
    objectSources.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppcVar10;
    psVar5 = cmSourceFile::GetFullPath_abi_cxx11_
                       ((cmSourceFile *)
                        objectSources.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->ExternalObjects,psVar5);
    __gnu_cxx::
    __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
    ::operator++(&__end1_1);
  }
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range1_2);
  cmGeneratorTarget::GetObjectSources
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range1_2,
             local_18);
  __end1_2 = std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::begin
                       ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                        &__range1_2);
  sf_2 = (cmSourceFile *)
         std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::end
                   ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
                    &__range1_2);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
                             *)&sf_2), bVar4) {
    ppcVar10 = __gnu_cxx::
               __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
               ::operator*(&__end1_2);
    WriteObjectRuleFiles(this,*ppcVar10);
    __gnu_cxx::
    __normal_iterator<const_cmSourceFile_**,_std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>_>
    ::operator++(&__end1_2);
  }
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range1_2);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&__range1_1);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
             &externalObjects.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
             &extraSources.
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&__range1);
  std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~vector
            ((vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)
             ((long)&currentBinDir.field_2 + 8));
  return;
}

Assistant:

void cmMakefileTargetGenerator::WriteTargetBuildRules()
{
  const std::string& config =
    this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");

  // write the custom commands for this target
  // Look for files registered for cleaning in this directory.
  if (const char* additional_clean_files =
        this->Makefile->GetProperty("ADDITIONAL_MAKE_CLEAN_FILES")) {
    cmGeneratorExpression ge;
    std::unique_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(additional_clean_files);

    cmSystemTools::ExpandListArgument(
      cge->Evaluate(this->LocalGenerator, config, false, this->GeneratorTarget,
                    nullptr, nullptr),
      this->CleanFiles);
  }

  // add custom commands to the clean rules?
  const char* clean_no_custom = this->Makefile->GetProperty("CLEAN_NO_CUSTOM");
  bool clean = cmSystemTools::IsOff(clean_no_custom);

  // First generate the object rule files.  Save a list of all object
  // files for this target.
  std::vector<cmSourceFile const*> customCommands;
  this->GeneratorTarget->GetCustomCommands(customCommands, config);
  std::string currentBinDir =
    this->LocalGenerator->GetCurrentBinaryDirectory();
  for (cmSourceFile const* sf : customCommands) {
    cmCustomCommandGenerator ccg(*sf->GetCustomCommand(), this->ConfigName,
                                 this->LocalGenerator);
    this->GenerateCustomRuleFile(ccg);
    if (clean) {
      const std::vector<std::string>& outputs = ccg.GetOutputs();
      for (std::string const& output : outputs) {
        this->CleanFiles.push_back(
          this->LocalGenerator->MaybeConvertToRelativePath(currentBinDir,
                                                           output));
      }
      const std::vector<std::string>& byproducts = ccg.GetByproducts();
      for (std::string const& byproduct : byproducts) {
        this->CleanFiles.push_back(
          this->LocalGenerator->MaybeConvertToRelativePath(currentBinDir,
                                                           byproduct));
      }
    }
  }

  // Add byproducts from build events to the clean rules
  if (clean) {
    std::vector<cmCustomCommand> buildEventCommands =
      this->GeneratorTarget->GetPreBuildCommands();

    buildEventCommands.insert(
      buildEventCommands.end(),
      this->GeneratorTarget->GetPreLinkCommands().begin(),
      this->GeneratorTarget->GetPreLinkCommands().end());
    buildEventCommands.insert(
      buildEventCommands.end(),
      this->GeneratorTarget->GetPostBuildCommands().begin(),
      this->GeneratorTarget->GetPostBuildCommands().end());

    for (const auto& be : buildEventCommands) {
      const std::vector<std::string>& byproducts = be.GetByproducts();
      for (std::string const& byproduct : byproducts) {
        this->CleanFiles.push_back(
          this->LocalGenerator->MaybeConvertToRelativePath(currentBinDir,
                                                           byproduct));
      }
    }
  }
  std::vector<cmSourceFile const*> headerSources;
  this->GeneratorTarget->GetHeaderSources(headerSources, config);
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    headerSources, this->MacOSXContentGenerator);
  std::vector<cmSourceFile const*> extraSources;
  this->GeneratorTarget->GetExtraSources(extraSources, config);
  this->OSXBundleGenerator->GenerateMacOSXContentStatements(
    extraSources, this->MacOSXContentGenerator);
  std::vector<cmSourceFile const*> externalObjects;
  this->GeneratorTarget->GetExternalObjects(externalObjects, config);
  for (cmSourceFile const* sf : externalObjects) {
    this->ExternalObjects.push_back(sf->GetFullPath());
  }
  std::vector<cmSourceFile const*> objectSources;
  this->GeneratorTarget->GetObjectSources(objectSources, config);
  for (cmSourceFile const* sf : objectSources) {
    // Generate this object file's rule file.
    this->WriteObjectRuleFiles(*sf);
  }
}